

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

UString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::toString_abi_cxx11_
          (UString *__return_storage_ptr__,Interpreter *this,LocationRange *loc)

{
  allocator<char32_t> local_41;
  UString local_40;
  
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>((u32string *)&local_40,L"",&local_41)
  ;
  anon_unknown_0::Interpreter::manifestJson
            (__return_storage_ptr__,(Interpreter *)this,loc,false,&local_40);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

UString toString(const LocationRange &loc)
    {
        return manifestJson(loc, false, U"");
    }